

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboSimian.cpp
# Opt level: O2

void __thiscall
chrono::robosimian::RS_Part::SetVisualizationType(RS_Part *this,VisualizationType vis)

{
  long local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  chrono::ChPhysicsItem::GetVisualModel();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
  if (local_28 != 0) {
    chrono::ChPhysicsItem::GetVisualModel();
    chrono::ChVisualModel::Clear();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
  }
  AddVisualizationAssets(this,vis);
  return;
}

Assistant:

void RS_Part::SetVisualizationType(VisualizationType vis) {
    if (m_body->GetVisualModel())
        m_body->GetVisualModel()->Clear();

    AddVisualizationAssets(vis);
}